

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fASTCDecompressionCases.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ASTCBlockCase2D::init(ASTCBlockCase2D *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ASTCRenderer2D *this_00;
  TestLog *pTVar1;
  MessageBuilder *pMVar2;
  size_type sVar3;
  ulong local_348 [3];
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  astc local_30 [16];
  astc local_20 [16];
  ASTCBlockCase2D *local_10;
  ASTCBlockCase2D *this_local;
  
  local_10 = this;
  this_00 = de::details::
            UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
            ::operator->(&(this->m_renderer).
                          super_UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
                        );
  tcu::astc::getBlockTestTypeColorScale(local_20,this->m_testType);
  tcu::astc::getBlockTestTypeColorBias(local_30,this->m_testType);
  ASTCDecompressionCaseInternal::ASTCRenderer2D::initialize
            (this_00,0x40,0x40,(Vec4 *)local_20,(Vec4 *)local_30);
  tcu::astc::generateBlockCaseTestData(&this->m_blockData,this->m_format,this->m_testType);
  pTVar1 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_330,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_330,(char (*) [7])"Total ");
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_blockData);
  local_348[0] = sVar3 >> 4;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_348);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [16])" blocks to test");
  pTVar1 = tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_1b0,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_1b0,
                      (char (*) [79])
                      "Note: Legitimate ASTC error pixels will be ignored when comparing to reference"
                     );
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  tcu::MessageBuilder::~MessageBuilder(&local_330);
  return extraout_EAX;
}

Assistant:

void ASTCBlockCase2D::init (void)
{
	m_renderer->initialize(64, 64, tcu::astc::getBlockTestTypeColorScale(m_testType), tcu::astc::getBlockTestTypeColorBias(m_testType));

	generateBlockCaseTestData(m_blockData, m_format, m_testType);
	DE_ASSERT(!m_blockData.empty());
	DE_ASSERT(m_blockData.size() % tcu::astc::BLOCK_SIZE_BYTES == 0);

	m_testCtx.getLog() << TestLog::Message << "Total " << m_blockData.size() / tcu::astc::BLOCK_SIZE_BYTES << " blocks to test" << TestLog::EndMessage
					   << TestLog::Message << "Note: Legitimate ASTC error pixels will be ignored when comparing to reference" << TestLog::EndMessage;
}